

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote-control.cpp
# Opt level: O0

int main(void)

{
  undefined1 uVar1;
  touch_sensor ts;
  remote_control rc;
  large_motor rmotor;
  large_motor lmotor;
  remote_control *in_stack_fffffffffffffba0;
  remote_control *in_stack_fffffffffffffba8;
  button *in_stack_fffffffffffffbb0;
  function<void_(bool)> *in_stack_fffffffffffffbb8;
  function<void_(bool)> *in_stack_fffffffffffffbc0;
  allocator *paVar2;
  large_motor *in_stack_fffffffffffffbc8;
  allocator *in_stack_fffffffffffffbd0;
  allocator *in_stack_fffffffffffffbd8;
  undefined6 in_stack_fffffffffffffbe0;
  undefined1 in_stack_fffffffffffffbe6;
  string *v;
  motor *this;
  address_type *in_stack_fffffffffffffbf8;
  large_motor *in_stack_fffffffffffffc00;
  int local_3ac;
  duration<long,std::ratio<1l,1000l>> local_3a8 [4];
  uint in_stack_fffffffffffffc5c;
  undefined4 in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc64;
  duration<long,std::ratio<1l,1000l>> local_398 [15];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  address_type *in_stack_fffffffffffffcc8;
  touch_sensor *in_stack_fffffffffffffcd0;
  string local_2f8 [32];
  motor local_2d8;
  undefined1 in_stack_fffffffffffffd5f;
  string *in_stack_fffffffffffffd60;
  allocator local_291;
  string local_290 [39];
  allocator local_269;
  string local_268 [39];
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  string local_1f8 [327];
  allocator local_b1;
  string local_b0 [95];
  allocator local_51;
  string local_50 [76];
  int local_4;
  
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"ev3-ports:outB",&local_51);
  ev3dev::large_motor::large_motor(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"ev3-ports:outC",&local_b1);
  ev3dev::large_motor::large_motor(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  ev3dev::remote_control::remote_control
            ((remote_control *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
             in_stack_fffffffffffffc5c);
  std::__cxx11::string::string(local_1f8,(string *)ev3dev::INPUT_AUTO_abi_cxx11_);
  ev3dev::touch_sensor::touch_sensor(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  std::__cxx11::string::~string(local_1f8);
  ev3dev::device::connected((device *)0x1224d5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"Motor on outB is not connected",&local_219);
  precondition(SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0),(string *)in_stack_fffffffffffffba8
              );
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  ev3dev::device::connected((device *)0x122554);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"Motor on outC is not connected",&local_241);
  precondition(SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0),(string *)in_stack_fffffffffffffba8
              );
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  ev3dev::remote_control::connected((remote_control *)0x1225d3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"Infrared sensor is not connected",&local_269);
  precondition(SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0),(string *)in_stack_fffffffffffffba8
              );
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  ev3dev::device::connected((device *)0x12264c);
  paVar2 = &local_291;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"Touch sensor is not connected",paVar2);
  precondition(SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0),(string *)in_stack_fffffffffffffba8
              );
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  roll<ev3dev::large_motor,std::vector<ev3dev::led*,std::allocator<ev3dev::led*>>>
            (in_stack_fffffffffffffbc8,
             (vector<ev3dev::led_*,_std::allocator<ev3dev::led_*>_> *)in_stack_fffffffffffffbc0,
             (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
  std::function<void_(bool)>::operator=(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::function<void_(bool)>::~function((function<void_(bool)> *)0x1226f9);
  roll<ev3dev::large_motor,std::vector<ev3dev::led*,std::allocator<ev3dev::led*>>>
            (in_stack_fffffffffffffbc8,
             (vector<ev3dev::led_*,_std::allocator<ev3dev::led_*>_> *)in_stack_fffffffffffffbc0,
             (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
  this = &local_2d8;
  std::function<void_(bool)>::operator=(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::function<void_(bool)>::~function((function<void_(bool)> *)0x122740);
  roll<ev3dev::large_motor,std::vector<ev3dev::led*,std::allocator<ev3dev::led*>>>
            (in_stack_fffffffffffffbc8,
             (vector<ev3dev::led_*,_std::allocator<ev3dev::led_*>_> *)in_stack_fffffffffffffbc0,
             (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
  v = local_2f8;
  std::function<void_(bool)>::operator=(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::function<void_(bool)>::~function((function<void_(bool)> *)0x122787);
  roll<ev3dev::large_motor,std::vector<ev3dev::led*,std::allocator<ev3dev::led*>>>
            (in_stack_fffffffffffffbc8,
             (vector<ev3dev::led_*,_std::allocator<ev3dev::led_*>_> *)in_stack_fffffffffffffbc0,
             (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
  std::function<void_(bool)>::operator=(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::function<void_(bool)>::~function((function<void_(bool)> *)0x1227d0);
  while (uVar1 = ev3dev::button::pressed(in_stack_fffffffffffffbb0), ((uVar1 ^ 0xff) & 1) != 0) {
    ev3dev::remote_control::process(in_stack_fffffffffffffba8);
    in_stack_fffffffffffffbe6 =
         ev3dev::touch_sensor::is_pressed
                   ((touch_sensor *)
                    CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0)),
                    SUB81((ulong)in_stack_fffffffffffffbd8 >> 0x38,0));
    if ((bool)in_stack_fffffffffffffbe6) {
      in_stack_fffffffffffffbd8 = &local_339;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffcc8,"Oops, excuse me!",in_stack_fffffffffffffbd8);
      ev3dev::sound::speak(in_stack_fffffffffffffd60,(bool)in_stack_fffffffffffffd5f);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffcc8);
      std::allocator<char>::~allocator((allocator<char> *)&local_339);
      in_stack_fffffffffffffbd0 = &local_361;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_360,"brake",in_stack_fffffffffffffbd0);
      ev3dev::motor::set_stop_action(this,v);
      ev3dev::motor::stop((motor *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffbe6,
                                                           in_stack_fffffffffffffbe0)));
      std::__cxx11::string::~string(local_360);
      std::allocator<char>::~allocator((allocator<char> *)&local_361);
      paVar2 = &local_389;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_388,"brake",paVar2);
      ev3dev::motor::set_stop_action(this,v);
      ev3dev::motor::stop((motor *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffbe6,
                                                           in_stack_fffffffffffffbe0)));
      std::__cxx11::string::~string(local_388);
      std::allocator<char>::~allocator((allocator<char> *)&local_389);
      ev3dev::led::set_color
                ((vector<ev3dev::led_*,_std::allocator<ev3dev::led_*>_> *)this,
                 (vector<float,_std::allocator<float>_> *)v);
      ev3dev::led::set_color
                ((vector<ev3dev::led_*,_std::allocator<ev3dev::led_*>_> *)this,
                 (vector<float,_std::allocator<float>_> *)v);
      in_stack_fffffffffffffbb0 =
           (button *)
           ev3dev::motor::set_time_sp
                     ((motor *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffbe6,
                                                       in_stack_fffffffffffffbe0)),
                      (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
      in_stack_fffffffffffffba8 =
           (remote_control *)
           ev3dev::motor::set_speed_sp
                     ((motor *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffbe6,
                                                       in_stack_fffffffffffffbe0)),
                      (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
      ev3dev::motor::run_timed
                ((motor *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffbe6,
                                                  in_stack_fffffffffffffbe0)));
      in_stack_fffffffffffffba0 =
           (remote_control *)
           ev3dev::motor::set_time_sp
                     ((motor *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffbe6,
                                                       in_stack_fffffffffffffbe0)),
                      (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
      ev3dev::motor::set_speed_sp
                ((motor *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffbe6,
                                                  in_stack_fffffffffffffbe0)),
                 (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
      ev3dev::motor::run_timed
                ((motor *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffbe6,
                                                  in_stack_fffffffffffffbe0)));
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                (local_398,(int *)&stack0xfffffffffffffc64);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffbd0);
      ev3dev::led::all_off();
    }
    local_3ac = 10;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_3a8,&local_3ac);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffbd0);
  }
  ev3dev::touch_sensor::~touch_sensor((touch_sensor *)0x122d78);
  ev3dev::remote_control::~remote_control(in_stack_fffffffffffffba0);
  ev3dev::large_motor::~large_motor((large_motor *)0x122d92);
  ev3dev::large_motor::~large_motor((large_motor *)0x122d9f);
  return local_4;
}

Assistant:

int main() {
    ev3::large_motor lmotor(ev3::OUTPUT_B);
    ev3::large_motor rmotor(ev3::OUTPUT_C);
    ev3::remote_control rc;
    ev3::touch_sensor   ts;

    precondition(lmotor.connected(), "Motor on outB is not connected");
    precondition(rmotor.connected(), "Motor on outC is not connected");
    precondition(rc.connected(),     "Infrared sensor is not connected");
    precondition(ts.connected(),     "Touch sensor is not connected");

    rc.on_red_up    = roll(lmotor, ev3::led::left,   1);
    rc.on_red_down  = roll(lmotor, ev3::led::left,  -1);
    rc.on_blue_up   = roll(rmotor, ev3::led::right,  1);
    rc.on_blue_down = roll(rmotor, ev3::led::right, -1);

    // Enter event processing loop
    while (!ev3::button::enter.pressed()) {
        rc.process();

        // Backup when an obstacle is bumped
        if (ts.is_pressed()) {
            ev3::sound::speak("Oops, excuse me!");

            lmotor.set_stop_action("brake").stop();
            rmotor.set_stop_action("brake").stop();

            // Turn red lights on
            ev3::led::set_color(ev3::led::left,  ev3::led::red);
            ev3::led::set_color(ev3::led::right, ev3::led::red);

            // Run both motors backwards for 0.5 seconds
            lmotor.set_time_sp(500).set_speed_sp(-900).run_timed();
            rmotor.set_time_sp(500).set_speed_sp(-900).run_timed();

            // Wait 0.5 seconds while motors are rolling
            std::this_thread::sleep_for(std::chrono::milliseconds(500));

            ev3::led::all_off();
        }

        std::this_thread::sleep_for(std::chrono::milliseconds(10));
    }
}